

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::js::api::json::PsbtOutputRequest::PsbtOutputRequest
          (PsbtOutputRequest *this,PsbtOutputRequest *param_1)

{
  (this->super_JsonClassBase<cfd::js::api::json::PsbtOutputRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__PsbtOutputRequest_00b409b8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  this->index_ = param_1->index_;
  PsbtOutputRequestData::PsbtOutputRequestData(&this->output_,&param_1->output_);
  return;
}

Assistant:

PsbtOutputRequest() {
    CollectFieldName();
  }